

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O3

ssize_t __thiscall
LASreadItemCompressed_POINT10_v2::read
          (LASreadItemCompressed_POINT10_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  U16 UVar5;
  U32 UVar6;
  U32 UVar7;
  I32 IVar8;
  int iVar9;
  ulong uVar10;
  ArithmeticModel *pAVar11;
  uint uVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  undefined8 *puVar14;
  StreamingMedian5 *pSVar15;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  byte local_31;
  
  puVar14 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  UVar6 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar6 == 0) {
    uVar10 = (ulong)(this->last_item[0xe] & 7);
    uVar19 = this->last_item[0xe] >> 3 & 7;
    uVar16 = (ulong)number_return_map[0][uVar10 + (uVar19 << 3)];
    local_31 = number_return_level[0][uVar10 + (uVar19 << 3)];
  }
  else {
    if ((UVar6 & 0x20) == 0) {
      bVar17 = this->last_item[0xe];
    }
    else {
      pAVar11 = this->m_bit_byte[this->last_item[0xe]];
      if (pAVar11 == (ArithmeticModel *)0x0) {
        pAVar11 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar11;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar11,(U32 *)0x0);
        pAVar11 = this->m_bit_byte[this->last_item[0xe]];
      }
      UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar11);
      bVar17 = (byte)UVar7;
      this->last_item[0xe] = bVar17;
    }
    bVar18 = bVar17 >> 3 & 7;
    uVar19 = (uint)bVar18;
    bVar1 = number_return_map[bVar18][bVar17 & 7];
    uVar16 = (ulong)bVar1;
    local_31 = number_return_level[bVar18][bVar17 & 7];
    if ((UVar6 & 0x10) == 0) {
      UVar5 = this->last_intensity[uVar16];
    }
    else {
      UVar7 = 3;
      if (bVar1 < 3) {
        UVar7 = (U32)bVar1;
      }
      IVar8 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)this->last_intensity[uVar16],UVar7);
      UVar5 = (U16)IVar8;
      this->last_intensity[uVar16] = UVar5;
    }
    *(U16 *)(this->last_item + 0xc) = UVar5;
    if ((UVar6 & 8) != 0) {
      pAVar11 = this->m_classification[this->last_item[0xf]];
      if (pAVar11 == (ArithmeticModel *)0x0) {
        pAVar11 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar11;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar11,(U32 *)0x0);
        pAVar11 = this->m_classification[this->last_item[0xf]];
      }
      UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar11);
      this->last_item[0xf] = (U8)UVar7;
    }
    if ((UVar6 & 4) != 0) {
      UVar7 = ArithmeticDecoder::decodeSymbol
                        (this->dec,
                         *(ArithmeticModel **)
                          ((long)this->m_scan_angle_rank + (ulong)(this->last_item[0xe] >> 3 & 8)));
      this->last_item[0x10] = this->last_item[0x10] + (char)UVar7;
    }
    if ((UVar6 & 2) != 0) {
      pAVar11 = this->m_user_data[this->last_item[0x11]];
      if (pAVar11 == (ArithmeticModel *)0x0) {
        pAVar11 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar11;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar11,(U32 *)0x0);
        pAVar11 = this->m_user_data[this->last_item[0x11]];
      }
      UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar11);
      this->last_item[0x11] = (U8)UVar7;
    }
    if ((UVar6 & 1) != 0) {
      IVar8 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar8;
    }
  }
  pSVar15 = this->last_x_diff_median5 + uVar16;
  uVar19 = (uint)((char)uVar19 == '\x01');
  iVar9 = IntegerCompressor::decompress
                    (this->ic_dx,this->last_x_diff_median5[uVar16].values[2],uVar19);
  *(int *)this->last_item = *(int *)this->last_item + iVar9;
  iVar2 = this->last_x_diff_median5[uVar16].values[2];
  if (this->last_x_diff_median5[uVar16].high == true) {
    iVar3 = this->last_x_diff_median5[uVar16].values[3];
    if (iVar9 < iVar2) {
      this->last_x_diff_median5[uVar16].values[4] = iVar3;
      this->last_x_diff_median5[uVar16].values[3] = iVar2;
      iVar2 = pSVar15->values[0];
      iVar3 = this->last_x_diff_median5[uVar16].values[1];
      if (iVar9 < iVar2) {
        this->last_x_diff_median5[uVar16].values[2] = iVar3;
        this->last_x_diff_median5[uVar16].values[1] = iVar2;
        pSVar15->values[0] = iVar9;
      }
      else if (iVar9 < iVar3) {
        this->last_x_diff_median5[uVar16].values[2] = iVar3;
        this->last_x_diff_median5[uVar16].values[1] = iVar9;
      }
      else {
LAB_00127e78:
        this->last_x_diff_median5[uVar16].values[2] = iVar9;
      }
    }
    else {
      if (iVar9 < iVar3) {
        this->last_x_diff_median5[uVar16].values[3] = iVar9;
        iVar9 = iVar3;
      }
      this->last_x_diff_median5[uVar16].values[4] = iVar9;
      this->last_x_diff_median5[uVar16].high = false;
    }
  }
  else {
    iVar3 = this->last_x_diff_median5[uVar16].values[1];
    if (iVar2 < iVar9) {
      pSVar15->values[0] = iVar3;
      this->last_x_diff_median5[uVar16].values[1] = iVar2;
      iVar2 = this->last_x_diff_median5[uVar16].values[3];
      iVar3 = this->last_x_diff_median5[uVar16].values[4];
      if (iVar3 < iVar9) {
        this->last_x_diff_median5[uVar16].values[2] = iVar2;
        this->last_x_diff_median5[uVar16].values[3] = iVar3;
        this->last_x_diff_median5[uVar16].values[4] = iVar9;
      }
      else {
        if (iVar9 <= iVar2) goto LAB_00127e78;
        this->last_x_diff_median5[uVar16].values[2] = iVar2;
        this->last_x_diff_median5[uVar16].values[3] = iVar9;
      }
    }
    else {
      if (iVar3 < iVar9) {
        this->last_x_diff_median5[uVar16].values[1] = iVar9;
        iVar9 = iVar3;
      }
      pSVar15->values[0] = iVar9;
      this->last_x_diff_median5[uVar16].high = true;
    }
  }
  pSVar15 = this->last_y_diff_median5 + uVar16;
  uVar13 = this->ic_dx->k;
  uVar12 = 0x14;
  if (uVar13 < 0x14) {
    uVar12 = uVar13 & 0xfffffffe;
  }
  iVar9 = IntegerCompressor::decompress
                    (this->ic_dy,this->last_y_diff_median5[uVar16].values[2],uVar12 | uVar19);
  *(int *)(this->last_item + 4) = *(int *)(this->last_item + 4) + iVar9;
  iVar2 = this->last_y_diff_median5[uVar16].values[2];
  if (this->last_y_diff_median5[uVar16].high == true) {
    iVar3 = this->last_y_diff_median5[uVar16].values[3];
    if (iVar2 <= iVar9) {
      if (iVar9 < iVar3) {
        this->last_y_diff_median5[uVar16].values[3] = iVar9;
        iVar9 = iVar3;
      }
      this->last_y_diff_median5[uVar16].values[4] = iVar9;
      this->last_y_diff_median5[uVar16].high = false;
      goto LAB_00127f68;
    }
    this->last_y_diff_median5[uVar16].values[4] = iVar3;
    this->last_y_diff_median5[uVar16].values[3] = iVar2;
    iVar2 = pSVar15->values[0];
    iVar3 = this->last_y_diff_median5[uVar16].values[1];
    if (iVar9 < iVar2) {
      this->last_y_diff_median5[uVar16].values[2] = iVar3;
      this->last_y_diff_median5[uVar16].values[1] = iVar2;
      pSVar15->values[0] = iVar9;
      goto LAB_00127f68;
    }
    if (iVar9 < iVar3) {
      this->last_y_diff_median5[uVar16].values[2] = iVar3;
      this->last_y_diff_median5[uVar16].values[1] = iVar9;
      goto LAB_00127f68;
    }
  }
  else {
    iVar3 = this->last_y_diff_median5[uVar16].values[1];
    if (iVar9 <= iVar2) {
      if (iVar3 < iVar9) {
        this->last_y_diff_median5[uVar16].values[1] = iVar9;
        iVar9 = iVar3;
      }
      pSVar15->values[0] = iVar9;
      this->last_y_diff_median5[uVar16].high = true;
      goto LAB_00127f68;
    }
    pSVar15->values[0] = iVar3;
    this->last_y_diff_median5[uVar16].values[1] = iVar2;
    iVar2 = this->last_y_diff_median5[uVar16].values[3];
    iVar3 = this->last_y_diff_median5[uVar16].values[4];
    if (iVar3 < iVar9) {
      this->last_y_diff_median5[uVar16].values[2] = iVar2;
      this->last_y_diff_median5[uVar16].values[3] = iVar3;
      this->last_y_diff_median5[uVar16].values[4] = iVar9;
      goto LAB_00127f68;
    }
    if (iVar2 < iVar9) {
      this->last_y_diff_median5[uVar16].values[2] = iVar2;
      this->last_y_diff_median5[uVar16].values[3] = iVar9;
      goto LAB_00127f68;
    }
  }
  this->last_y_diff_median5[uVar16].values[2] = iVar9;
LAB_00127f68:
  uVar12 = this->ic_dy->k + this->ic_dx->k;
  uVar13 = 0x12;
  if (uVar12 < 0x24) {
    uVar13 = uVar12 >> 1 & 0xfffffffe;
  }
  IVar8 = IntegerCompressor::decompress(this->ic_z,this->last_height[local_31],uVar13 | uVar19);
  *(I32 *)(this->last_item + 8) = IVar8;
  this->last_height[local_31] = IVar8;
  uVar19 = *(uint *)(this->last_item + 0x10);
  *(uint *)(puVar14 + 2) = uVar19;
  uVar4 = *(undefined8 *)(this->last_item + 8);
  *puVar14 = *(undefined8 *)this->last_item;
  puVar14[1] = uVar4;
  return (ulong)uVar19;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v2::read(U8* item, U32& context)
{
  U32 r, n, m, l;
  U32 k_bits;
  I32 median, diff;

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 32)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];

    // decompress the intensity if it has changed
    if (changed_values & 16)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(last_intensity[m], (m < 3 ? m : 3));
      last_intensity[m] = ((LASpoint10*)last_item)->intensity;
    }
    else
    {
      ((LASpoint10*)last_item)->intensity = last_intensity[m];
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      I32 val = dec->decodeSymbol(m_scan_angle_rank[((LASpoint10*)last_item)->scan_direction_flag]);
      last_item[16] = U8_FOLD(val + last_item[16]);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }
  else
  {
    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];
  }

  // decompress x coordinate
  median = last_x_diff_median5[m].get();
  diff = ic_dx->decompress(median, n==1);
  ((LASpoint10*)last_item)->x += diff;
  last_x_diff_median5[m].add(diff);

  // decompress y coordinate
  median = last_y_diff_median5[m].get();
  k_bits = ic_dx->getK();
  diff = ic_dy->decompress(median, (n==1) + ( k_bits < 20 ? U32_ZERO_BIT_0(k_bits) : 20 ));
  ((LASpoint10*)last_item)->y += diff;
  last_y_diff_median5[m].add(diff);

  // decompress z coordinate
  k_bits = (ic_dx->getK() + ic_dy->getK()) / 2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(last_height[l], (n==1) + (k_bits < 18 ? U32_ZERO_BIT_0(k_bits) : 18));
  last_height[l] = ((LASpoint10*)last_item)->z;

  // copy the last point
  memcpy(item, last_item, 20);
}